

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::DepthRangeWriteCase::iterate(DepthRangeWriteCase *this)

{
  RenderContext *pRVar1;
  Vec4 *pVVar2;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  GLuint index;
  GLenum GVar6;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *this_01;
  uint uVar8;
  char *description;
  int stepNdx;
  int iVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vec4 color;
  Surface referenceFrame;
  Surface renderedFrame;
  ProgramSources sources;
  Random rnd;
  ShaderProgram program;
  undefined1 local_330 [8];
  float local_328;
  undefined4 local_324;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  Surface local_310;
  TestLog *local_2f8;
  Surface local_2f0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  value_type local_2b8;
  undefined1 local_298 [8];
  float local_290;
  undefined8 local_28c;
  int local_284;
  float local_280;
  undefined1 *local_27c;
  undefined4 local_274;
  float local_270;
  undefined1 *local_26c;
  undefined4 local_264;
  float local_260;
  undefined4 local_25c;
  ios_base local_220 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_208;
  undefined1 local_1e8 [216];
  deRandom local_110;
  ShaderProgram local_100;
  int *piVar7;
  
  local_2f8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_110,dVar4);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar7 = (int *)CONCAT44(extraout_var,iVar5);
  iVar5 = *piVar7;
  iVar10 = 0x80;
  if (iVar5 < 0x80) {
    iVar10 = iVar5;
  }
  iVar9 = 0x80;
  if (piVar7[1] < 0x80) {
    iVar9 = piVar7[1];
  }
  dVar4 = deRandom_getUint32(&local_110);
  local_2d8._0_4_ = dVar4 % ((iVar5 - iVar10) + 1U);
  iVar5 = piVar7[1];
  dVar4 = deRandom_getUint32(&local_110);
  uVar8 = dVar4 % ((iVar5 - iVar9) + 1U);
  tcu::Surface::Surface(&local_2f0,iVar10,iVar9);
  tcu::Surface::Surface(&local_310,iVar10,iVar9);
  if (piVar7[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0x130);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_330 = (undefined1  [8])&local_320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_330,
             "attribute highp vec4 a_position;\nattribute highp vec2 a_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,
             "uniform mediump vec4 u_color;\nvoid main (void)\n{\n\tgl_FragColor = u_color;\n}\n",""
            );
  local_1e8[0x10] = 0;
  local_1e8._17_8_ = 0;
  local_1e8._0_8_ = (pointer)0x0;
  local_1e8[8] = 0;
  local_1e8._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_298,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298,(value_type *)local_330);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_280,&local_2b8);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar1,(ProgramSources *)local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_208);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_298 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_330 != (undefined1  [8])&local_320) {
    operator_delete((void *)local_330,local_320._M_allocated_capacity + 1);
  }
  if (local_100.m_program.m_info.linkOk != false) {
    local_2c8._0_4_ = glwGetUniformLocation(local_100.m_program.m_program,"u_color");
    index = glwGetAttribLocation(local_100.m_program.m_program,"a_position");
    local_298 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_290);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_290,"glDepthRangef(",0xe);
    std::ostream::_M_insert<double>((double)this->m_zNear);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_290,", ",2);
    std::ostream::_M_insert<double>((double)this->m_zFar);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_290,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_290);
    std::ios_base::~ios_base(local_220);
    glwViewport(local_2d8._0_4_,uVar8,iVar10,iVar9);
    glwClear(0x4500);
    glwEnable(0xb71);
    glwUseProgram(local_100.m_program.m_program);
    glwEnableVertexAttribArray(index);
    local_298._0_4_ = 0xbf800000;
    local_298._4_4_ = 0xbf800000;
    pVVar2 = this->m_depthCoord;
    local_290 = pVVar2->m_data[0];
    local_28c = 0xbf8000003f800000;
    local_284 = 0x3f800000;
    local_280 = pVVar2->m_data[1];
    local_27c = &DAT_3f8000003f800000;
    local_274 = 0xbf800000;
    local_270 = pVVar2->m_data[2];
    local_26c = &DAT_3f8000003f800000;
    local_264 = 0x3f800000;
    local_260 = pVVar2->m_data[3];
    local_25c = 0x3f800000;
    glwDepthFunc(0x207);
    glwDepthRangef(this->m_zNear,this->m_zFar);
    glwUniform4f(local_2c8._0_4_,0.0,1.0,0.0,1.0);
    glwVertexAttribPointer(index,4,0x1406,'\0',0,local_298);
    glwDrawElements(4,6,0x1403,iterate::quadIndices);
    GVar6 = glwGetError();
    glu::checkError(GVar6,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                    ,0x156);
    glwDepthFunc(0x203);
    glwDepthMask('\0');
    glwDepthRangef(0.0,1.0);
    iVar5 = 0;
    do {
      local_328 = (float)iVar5 * 0.032258064;
      local_330._4_4_ = local_328;
      local_330._0_4_ = local_328;
      local_290 = local_328 + local_328 + -1.0;
      local_324 = 0x3f800000;
      local_298._0_4_ = 0xbf800000;
      local_298._4_4_ = 0xbf800000;
      local_28c = 0xbf8000003f800000;
      local_284 = 0x3f800000;
      local_27c = &DAT_3f8000003f800000;
      local_274 = 0xbf800000;
      local_26c = &DAT_3f8000003f800000;
      local_264 = 0x3f800000;
      local_25c = 0x3f800000;
      local_280 = local_290;
      local_270 = local_290;
      local_260 = local_290;
      glwUniform4fv(local_2c8._0_4_,1,(GLfloat *)local_330);
      glwVertexAttribPointer(index,4,0x1406,'\0',0,local_298);
      glwDrawElements(4,6,0x1403,iterate::quadIndices);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x20);
    GVar6 = glwGetError();
    glu::checkError(GVar6,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                    ,0x172);
    pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_330._0_4_ = RGBA;
    local_330._4_4_ = UNORM_INT8;
    if ((void *)local_2f0.m_pixels.m_cap != (void *)0x0) {
      local_2f0.m_pixels.m_cap = (size_t)local_2f0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_298,(TextureFormat *)local_330,local_2f0.m_width,
               local_2f0.m_height,1,(void *)local_2f0.m_pixels.m_cap);
    glu::readPixels(pRVar1,local_2d8._0_4_,uVar8,(PixelBufferAccess *)local_298);
    if (0 < local_310.m_height) {
      pVVar2 = this->m_depthCoord;
      fVar14 = this->m_zNear;
      fVar13 = this->m_zFar;
      fVar12 = 1.0;
      if (fVar14 <= 1.0) {
        fVar12 = fVar14;
      }
      fVar12 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar12);
      fVar14 = 1.0;
      if (fVar13 <= 1.0) {
        fVar14 = fVar13;
      }
      fVar14 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar14);
      local_2d8 = ZEXT416((uint)((fVar14 - fVar12) * 0.5));
      local_2c8 = ZEXT416((uint)((fVar14 + fVar12) * 0.5));
      iVar5 = 0;
      do {
        if (0 < local_310.m_width) {
          iVar10 = 0;
          do {
            iVar9 = local_310.m_width;
            fVar13 = ((float)iVar10 + 0.5) / (float)local_310.m_width;
            fVar14 = ((float)iVar5 + 0.5) / (float)local_310.m_height;
            if (1.0 <= fVar13 + fVar14) {
              fVar12 = pVVar2->m_data[3];
              fVar13 = (pVVar2->m_data[1] - fVar12) * (1.0 - fVar13) + fVar12;
              fVar14 = (pVVar2->m_data[2] - fVar12) * (1.0 - fVar14);
            }
            else {
              fVar12 = pVVar2->m_data[0];
              fVar13 = (pVVar2->m_data[2] - fVar12) * fVar13 + fVar12;
              fVar14 = (pVVar2->m_data[1] - fVar12) * fVar14;
            }
            fVar14 = floorf(((fVar14 + fVar13) * (float)local_2d8._0_4_ + (float)local_2c8._0_4_) /
                            0.032258064);
            fVar14 = (float)(int)fVar14 * 0.032258064 * 255.0;
            uVar8 = (uint)(fVar14 + *(float *)(&DAT_01bc5724 + (ulong)(fVar14 < 0.0) * 4));
            if (0xfe < (int)uVar8) {
              uVar8 = 0xff;
            }
            if ((int)uVar8 < 1) {
              uVar8 = 0;
            }
            *(uint *)((long)local_310.m_pixels.m_ptr + (long)(iVar9 * iVar5 + iVar10) * 4) =
                 uVar8 << 0x10 | uVar8 << 8 | uVar8 | 0xff000000;
            iVar10 = iVar10 + 1;
          } while (iVar10 < local_310.m_width);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_310.m_height);
    }
    bVar3 = tcu::fuzzyCompare(local_2f8,"Result","Image comparison result",&local_310,&local_2f0,
                              0.05,COMPARE_LOG_RESULT);
    description = "Fail";
    if (bVar3) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar3,
               description);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    tcu::Surface::~Surface(&local_310);
    tcu::Surface::~Surface(&local_2f0);
    return STOP;
  }
  glu::operator<<(local_2f8,&local_100);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
             ,0x137);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

DepthRangeWriteCase::IterateResult DepthRangeWriteCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderContext().getRenderTarget();
	const int					viewportW		= de::min(128, renderTarget.getWidth());
	const int					viewportH		= de::min(128, renderTarget.getHeight());
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame	(viewportW, viewportH);
	tcu::Surface				referenceFrame	(viewportW, viewportH);
	const int					numDepthSteps	= VISUALIZE_DEPTH_STEPS;
	const float					depthStep		= 1.0f/(float)(numDepthSteps-1);

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_fragmentShaderSrc));

	if (!program.isOk())
	{
		log << program;
		TCU_FAIL("Compile failed");
	}

	const int					colorLoc		= glGetUniformLocation(program.getProgram(), "u_color");
	const int					posLoc			= glGetAttribLocation(program.getProgram(), "a_position");

	m_testCtx.getLog() << TestLog::Message << "glDepthRangef(" << m_zNear << ", " << m_zFar << ")" << TestLog::EndMessage;

	glViewport(viewportX, viewportY, viewportW, viewportH);
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);
	glUseProgram(program.getProgram());
	glEnableVertexAttribArray(posLoc);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Render with depth range.
	{
		const float position[] =
		{
			-1.0f, -1.0f, m_depthCoord[0], 1.0f,
			-1.0f, +1.0f, m_depthCoord[1], 1.0f,
			+1.0f, -1.0f, m_depthCoord[2], 1.0f,
			+1.0f, +1.0f, m_depthCoord[3], 1.0f
		};

		glDepthFunc(GL_ALWAYS);
		glDepthRangef(m_zNear, m_zFar);
		glUniform4f(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);
		GLU_CHECK();
	}

	// Visualize by rendering full-screen quads with increasing depth and color.
	{
		glDepthFunc(GL_LEQUAL);
		glDepthMask(GL_FALSE);
		glDepthRangef(0.0f, 1.0f);

		for (int stepNdx = 0; stepNdx < numDepthSteps; stepNdx++)
		{
			float	f		= (float)stepNdx*depthStep;
			float	depth	= f*2.0f - 1.0f;
			Vec4	color	= Vec4(f, f, f, 1.0f);

			float position[] =
			{
				-1.0f, -1.0f, depth, 1.0f,
				-1.0f, +1.0f, depth, 1.0f,
				+1.0f, -1.0f, depth, 1.0f,
				+1.0f, +1.0f, depth, 1.0f
			};

			glUniform4fv(colorLoc, 1, color.getPtr());
			glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
			glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);
		}

		GLU_CHECK();
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		for (int x = 0; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			int		step	= (int)deFloatFloor(d / depthStep);
			int		col		= de::clamp(deRoundFloatToInt32((float)step*depthStep*255.0f), 0, 255);

			referenceFrame.setPixel(x, y, tcu::RGBA(col, col, col, 0xff));
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}